

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O3

void qrsolv(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double *x,double *sdiag)

{
  double dVar1;
  void *__ptr;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  double *pdVar6;
  double *pdVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double *local_88;
  long local_80;
  
  __ptr = malloc((long)N * 8);
  if (0 < N) {
    iVar2 = N + 1;
    uVar11 = (ulong)(uint)N;
    uVar9 = 0;
    uVar10 = 0;
    uVar4 = uVar11;
    pdVar6 = r;
    pdVar7 = r;
    do {
      uVar13 = 0;
      pdVar12 = pdVar6;
      do {
        *pdVar12 = pdVar7[uVar9 + uVar13];
        uVar13 = uVar13 + 1;
        pdVar12 = pdVar12 + uVar11;
      } while (uVar4 != uVar13);
      x[uVar10] = r[iVar2 * (int)uVar10];
      *(double *)((long)__ptr + uVar10 * 8) = qtb[uVar10];
      uVar10 = uVar10 + 1;
      pdVar7 = pdVar7 + 1;
      uVar9 = (ulong)(uint)((int)uVar9 + N);
      pdVar6 = pdVar6 + uVar11 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar10 != uVar11);
    if (0 < N) {
      local_88 = r + uVar11;
      local_80 = 1;
      uVar4 = 0;
      do {
        iVar3 = ipvt[uVar4];
        if ((diag[iVar3] != 0.0) || (NAN(diag[iVar3]))) {
          memset(sdiag + uVar4,0,(ulong)(~(uint)uVar4 + N) * 8 + 8);
          sdiag[uVar4] = diag[iVar3];
          dVar18 = 0.0;
          uVar10 = uVar4;
          pdVar6 = local_88;
          lVar15 = local_80;
          do {
            dVar16 = sdiag[uVar10];
            if ((dVar16 != 0.0) || (NAN(dVar16))) {
              iVar3 = iVar2 * (int)uVar10;
              dVar19 = r[iVar3];
              if (ABS(dVar16) <= ABS(dVar19)) {
                dVar16 = dVar16 / dVar19;
                dVar19 = dVar16 * 0.25 * dVar16 + 0.25;
                if (dVar19 < 0.0) {
                  dVar19 = sqrt(dVar19);
                }
                else {
                  dVar19 = SQRT(dVar19);
                }
                dVar19 = 0.5 / dVar19;
                dVar16 = dVar16 * dVar19;
              }
              else {
                dVar19 = dVar19 / dVar16;
                dVar16 = dVar19 * 0.25 * dVar19 + 0.25;
                if (dVar16 < 0.0) {
                  dVar16 = sqrt(dVar16);
                }
                else {
                  dVar16 = SQRT(dVar16);
                }
                dVar16 = 0.5 / dVar16;
                dVar19 = dVar19 * dVar16;
              }
              r[iVar3] = r[iVar3] * dVar19 + sdiag[uVar10] * dVar16;
              dVar1 = *(double *)((long)__ptr + uVar10 * 8);
              dVar17 = dVar18 * dVar16;
              dVar18 = dVar18 * dVar19 - dVar1 * dVar16;
              *(double *)((long)__ptr + uVar10 * 8) = dVar19 * dVar1 + dVar17;
              if ((long)uVar10 <= (long)N + -2) {
                lVar5 = lVar15;
                pdVar7 = pdVar6;
                do {
                  dVar1 = *pdVar7;
                  dVar17 = sdiag[lVar5];
                  sdiag[lVar5] = dVar1 * -dVar16 + dVar17 * dVar19;
                  *pdVar7 = dVar19 * dVar1 + dVar16 * dVar17;
                  lVar5 = lVar5 + 1;
                  pdVar7 = pdVar7 + uVar11;
                } while ((int)lVar5 < N);
              }
            }
            uVar10 = uVar10 + 1;
            lVar15 = lVar15 + 1;
            pdVar6 = pdVar6 + uVar11 + 1;
          } while (uVar10 != uVar11);
        }
        iVar3 = iVar2 * (uint)uVar4;
        sdiag[uVar4] = r[iVar3];
        r[iVar3] = x[uVar4];
        uVar4 = uVar4 + 1;
        local_80 = local_80 + 1;
        local_88 = local_88 + uVar11 + 1;
      } while (uVar4 != uVar11);
      uVar10 = 0;
      uVar4 = (ulong)(uint)N;
      do {
        uVar9 = uVar10 & 0xffffffff;
        if (sdiag[uVar10] != 0.0) {
          uVar9 = uVar4;
        }
        if (NAN(sdiag[uVar10])) {
          uVar9 = uVar4;
        }
        if ((int)uVar4 != N) {
          uVar9 = uVar4;
        }
        iVar3 = (int)uVar9;
        if (iVar3 < N) {
          *(undefined8 *)((long)__ptr + uVar10 * 8) = 0;
        }
        uVar10 = uVar10 + 1;
        uVar4 = uVar9;
      } while (uVar11 != uVar10);
      if (0 < iVar3) {
        iVar2 = iVar2 * iVar3 + -1;
        uVar4 = 1;
        lVar15 = 0;
        do {
          lVar14 = uVar9 - uVar4;
          dVar18 = 0.0;
          lVar5 = lVar15;
          iVar8 = iVar2;
          if (lVar14 <= (long)(uVar9 - 2)) {
            do {
              dVar18 = dVar18 + r[iVar8] *
                                *(double *)
                                 ((long)__ptr + lVar5 * 8 + (long)(int)(iVar3 + 1U) * 8 + -8);
              lVar5 = lVar5 + 1;
              iVar8 = iVar8 + N;
            } while ((int)lVar5 != 0);
          }
          *(double *)((long)__ptr + lVar14 * 8) =
               (*(double *)((long)__ptr + lVar14 * 8) - dVar18) / sdiag[lVar14];
          uVar4 = uVar4 + 1;
          iVar2 = iVar2 + ~N;
          lVar15 = lVar15 + -1;
        } while (uVar4 != iVar3 + 1U);
      }
      if (0 < N) {
        uVar4 = 0;
        do {
          x[ipvt[uVar4]] = *(double *)((long)__ptr + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar11 != uVar4);
      }
    }
  }
  free(__ptr);
  return;
}

Assistant:

void qrsolv(double *r,int ldr,int N,int *ipvt,double *diag,double *qtb,double *x,double *sdiag) {
	int i,j,jp1,k,kp1,l,nsing,t;
	double cos,cotan,p5,p25,qtbpj,sin,sum,tan,temp,zero;
	double *wa;

	/*
	 *   This routine is a C translation of Fortran Code by
     *     argonne national laboratory. minpack project. march 1980.
      	  burton s. garbow, kenneth e. hillstrom, jorge j. more
	 * N is a positive integer input variable set to the order of r.

       r is an N by N array. on input the full upper triangle
         must contain the full upper triangle of the matrix r.
         on output the full upper triangle is unaltered, and the
         strict lower triangle contains the strict upper triangle
         (transposed) of the upper triangular matrix s.

       ldr is a positive integer input variable not less than n
         which specifies the leading dimension of the array r.

       ipvt is an integer input array of length N which defines the
         permutation matrix p such that a*p = q*r. column j of p
         is column ipvt(j) of the identity matrix.

       diag is an input array of length N which must contain the
         diagonal elements of the matrix d.

       qtb is an input array of length N which must contain the first
         N elements of the vector (q transpose)*b.

       x is an output array of length N which contains the least
         squares solution of the system a*x = b, d*x = 0.

       sdiag is an output array of length N which contains the
         diagonal elements of the upper triangular matrix s.
	 */

	wa = (double*) malloc(sizeof(double) *N);

	p5 = 5.0e-1;
	p25 = 2.5e-1;
	zero = 0.0;

	//     copy r and (q transpose)*b to preserve input and initialize s.
	//     in particular, save the diagonal elements of r in x.

	for(j = 0; j < N;++j) {
		for(i = j; i < N;++i) {
			r[i*N+j] = r[j*N+i];
		}
		x[j] = r[j*N+j];
		wa[j] = qtb[j];
	}

	//eliminate the diagonal matrix d using a givens rotation.

	for(j = 0; j < N;++j) { //100

		//        prepare the row of d to be eliminated, locating the
		//        diagonal element using p from the qr factorization.

		l = ipvt[j];

		if (diag[l] != zero) { //90
			for(k = j; k < N;++k) {
				sdiag[k] = zero;
			}

			sdiag[j] = diag[l];

			//        the transformations to eliminate the row of d
			//        modify only a single element of (q transpose)*b
			//        beyond the first n, which is initially zero.

			qtbpj = zero;

			for(k = j; k < N;++k) { //80
				t = k * N;
				//     determine a givens rotation which eliminates the
				//     appropriate element in the current row of d.

				if (sdiag[k] != zero) { //70
					if (fabs(r[t+k]) < fabs(sdiag[k])) {
						cotan = r[t+k]/sdiag[k];
			            sin = p5/sqrt(p25+p25*cotan*cotan);
			            cos = sin*cotan;
					} else {
			            tan = sdiag[k]/r[t+k];
			            cos = p5/sqrt(p25+p25*tan*tan);
			            sin = cos*tan;
					}
					//           compute the modified diagonal element of r and
					//           the modified element of ((q transpose)*b,0).
		            r[t+k] = cos*r[t+k] + sin*sdiag[k];
		            temp = cos*wa[k] + sin*qtbpj;
		            qtbpj = -sin*wa[k] + cos*qtbpj;
		            wa[k] = temp;

		            //           accumulate the tranformation in the row of s.
		            kp1 = k + 1;

		            if (N >= kp1+1) {//71
		            	for(i = kp1;i < N;++i) {
		                    temp = cos*r[i*N+k] + sin*sdiag[i];
		                    sdiag[i] = -sin*r[i*N+k] + cos*sdiag[i];
		                    r[i*N+k] = temp;
		            	}
		            }//71
				}//70
			}//80
		} //90
		//        store the diagonal element of s and restore
		//        the corresponding diagonal element of r.

        sdiag[j] = r[j*N+j];
        r[j*N+j] = x[j];

	}//100

	//     solve the triangular system for z. if the system is
	//     singular, then obtain a least squares solution.

	nsing = N;

	for(j = 1; j <= N;++j) {
		if (sdiag[j-1] == zero && nsing == N) {
			nsing = j - 1;
		}
		if (nsing < N) {
			wa[j-1] = zero;
		}
	}

	if (nsing >= 1) {//150
		for(k = 1; k <= nsing;++k) {
	         j = nsing - k + 1;
	         sum = zero;
	         jp1 = j + 1;

	         if (nsing >= jp1) {
	        	 for (i = jp1; i <= nsing;++i) {
	        		 sum = sum + r[(i-1)*N+j-1]*wa[i-1];
	        	 }
	         }
	         wa[j-1] = (wa[j-1] - sum)/sdiag[j-1];
		}
	}//150

	//     permute the components of z back to components of x.

	for (j = 0; j < N;++j) {
        l = ipvt[j];
        x[l] = wa[j];
	}


	free(wa);
}